

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.cpp
# Opt level: O1

void __thiscall chrono::ChTimestepper::ArchiveOUT(ChTimestepper *this,ChArchiveOut *archive)

{
  Type type;
  Type_mapper_conflict typemapper;
  ChEnumMapper<chrono::ChTimestepper::Type> local_78;
  Type local_54;
  Type_mapper local_50;
  char *local_30;
  undefined1 *local_28;
  undefined1 local_20;
  
  ChArchiveOut::VersionWrite<chrono::ChTimestepper>(archive);
  my_enum_mappers::Type_mapper::Type_mapper(&local_50);
  local_54 = (*this->_vptr_ChTimestepper[2])(this);
  my_enum_mappers::Type_mapper::operator()(&local_78,&local_50,&local_54);
  local_30 = "timestepper_type";
  local_20 = 0;
  local_28 = (undefined1 *)&local_78;
  (*(archive->super_ChArchive)._vptr_ChArchive[0xb])(archive);
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b6ba38
  ;
  if (local_78.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepper::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepper::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepper::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepper::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_78.value_ptr = (Type *)&this->verbose;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9e18f7;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepper::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepper::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(archive->super_ChArchive)._vptr_ChArchive[2])(archive);
  local_78.value_ptr = (Type *)&this->Qc_do_clamp;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa0dfe7;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepper::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepper::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(archive->super_ChArchive)._vptr_ChArchive[2])(archive);
  local_78.value_ptr = (Type *)&this->Qc_clamping;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa0dff3;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepper::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepper::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(archive->super_ChArchive)._vptr_ChArchive[4])(archive);
  local_50.super_ChEnumMapper<chrono::ChSolver::Type>.super_ChEnumMapperBase._vptr_ChEnumMapperBase
       = (_func_int **)&PTR_GetValueAsInt_00b6ba38;
  if (local_50.super_ChEnumMapper<chrono::ChSolver::Type>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super_ChEnumMapper<chrono::ChSolver::Type>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChTimestepper::ArchiveOUT(ChArchiveOut& archive) {
    // version number
    archive.VersionWrite<ChTimestepper>();
    // method type:
    my_enum_mappers::Type_mapper typemapper;
    Type type = GetType();
    archive << CHNVP(typemapper(type), "timestepper_type");
    // serialize all member data:
    archive << CHNVP(verbose);
    archive << CHNVP(Qc_do_clamp);
    archive << CHNVP(Qc_clamping);
}